

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9_hashmap_sum(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_hashmap *pMap_00;
  int iVar1;
  jx9_value *pjVar2;
  jx9_value *pObj;
  jx9_hashmap *pMap;
  jx9_value **apArg_local;
  int nArg_local;
  jx9_context *pCtx_local;
  
  if (nArg < 1) {
    jx9_result_int(pCtx,0);
  }
  else {
    iVar1 = jx9_value_is_json_array(*apArg);
    if (iVar1 == 0) {
      jx9_result_int(pCtx,0);
    }
    else {
      pMap_00 = (jx9_hashmap *)((*apArg)->x).pOther;
      if (pMap_00->nEntry == 0) {
        jx9_result_int(pCtx,0);
      }
      else {
        pjVar2 = HashmapExtractNodeValue(pMap_00->pFirst);
        if (pjVar2 == (jx9_value *)0x0) {
          jx9_result_int(pCtx,0);
        }
        else if ((pjVar2->iFlags & 4U) == 0) {
          Int64Sum(pCtx,pMap_00);
        }
        else {
          DoubleSum(pCtx,pMap_00);
        }
      }
    }
  }
  return 0;
}

Assistant:

static int jx9_hashmap_sum(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	jx9_hashmap *pMap;
	jx9_value *pObj;
	if( nArg < 1 ){
		/* Missing arguments, return 0 */
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	/* Make sure we are dealing with a valid hashmap */
	if( !jx9_value_is_json_array(apArg[0]) ){
		/* Invalid argument, return 0 */
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	pMap = (jx9_hashmap *)apArg[0]->x.pOther;
	if( pMap->nEntry < 1 ){
		/* Nothing to compute, return 0 */
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	/* If the first element is of type float, then perform floating
	 * point computaion.Otherwise switch to int64 computaion.
	 */
	pObj = HashmapExtractNodeValue(pMap->pFirst);
	if( pObj == 0 ){
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	if( pObj->iFlags & MEMOBJ_REAL ){
		DoubleSum(pCtx, pMap);
	}else{
		Int64Sum(pCtx, pMap);
	}
	return JX9_OK;
}